

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool __thiscall
Parameter<unsigned_long>::internalSetData<std::__cxx11::string>
          (Parameter<unsigned_long> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  string asStack_28 [32];
  
  std::__cxx11::string::string(asStack_28,(string *)data);
  std::__cxx11::string::~string(asStack_28);
  return false;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }